

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::EnforceDirectoryLevelRules(cmMakefile *this)

{
  uint uVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  string local_1d8;
  string local_1b8;
  ostringstream local_188 [8];
  ostringstream msg;
  cmMakefile *this_local;
  
  if ((this->CheckCMP0000 & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar3 = std::operator<<((ostream *)local_188,"No cmake_minimum_required command is present.  ")
    ;
    poVar3 = std::operator<<(poVar3,"A line of code such as\n");
    poVar3 = std::operator<<(poVar3,"  cmake_minimum_required(VERSION ");
    uVar1 = cmVersion::GetMajorVersion();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
    poVar3 = std::operator<<(poVar3,".");
    uVar1 = cmVersion::GetMinorVersion();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
    poVar3 = std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(poVar3,"should be added at the top of the file.  ");
    poVar3 = std::operator<<(poVar3,"The version specified may be lower if you wish to ");
    poVar3 = std::operator<<(poVar3,"support older CMake versions for this project.  ");
    poVar3 = std::operator<<(poVar3,"For more information run ");
    std::operator<<(poVar3,"\"cmake --help-policy CMP0000\".");
    PVar2 = GetPolicyStatus(this,CMP0000);
    if (PVar2 != OLD) {
      if (PVar2 == WARN) {
        std::__cxx11::ostringstream::str();
        IssueMessage(this,AUTHOR_WARNING,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      else if (PVar2 - NEW < 3) {
        std::__cxx11::ostringstream::str();
        IssueMessage(this,FATAL_ERROR,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        cmSystemTools::SetFatalErrorOccured();
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return;
}

Assistant:

void cmMakefile::EnforceDirectoryLevelRules() const
{
  // Diagnose a violation of CMP0000 if necessary.
  if(this->CheckCMP0000)
    {
    std::ostringstream msg;
    msg << "No cmake_minimum_required command is present.  "
        << "A line of code such as\n"
        << "  cmake_minimum_required(VERSION "
        << cmVersion::GetMajorVersion() << "."
        << cmVersion::GetMinorVersion()
        << ")\n"
        << "should be added at the top of the file.  "
        << "The version specified may be lower if you wish to "
        << "support older CMake versions for this project.  "
        << "For more information run "
        << "\"cmake --help-policy CMP0000\".";
    switch (this->GetPolicyStatus(cmPolicies::CMP0000))
      {
      case cmPolicies::WARN:
        // Warn because the user did not provide a mimimum required
        // version.
        this->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
      case cmPolicies::OLD:
        // OLD behavior is to use policy version 2.4 set in
        // cmListFileCache.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // NEW behavior is to issue an error.
        this->IssueMessage(cmake::FATAL_ERROR, msg.str());
        cmSystemTools::SetFatalErrorOccured();
        return;
      }
    }
}